

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.c
# Opt level: O0

void * object_getIndexedIvars(id obj)

{
  BOOL BVar1;
  long local_50;
  size_t size;
  id obj_local;
  uintptr_t addr_1;
  Class local_28;
  uintptr_t addr;
  Class local_10;
  
  if (obj == (id)0x0) {
    obj_local = (id)0x0;
  }
  else {
    BVar1 = isSmallObject(obj);
    if (BVar1 == '\0') {
      local_10 = obj->isa;
    }
    else {
      local_10 = SmallObjectClasses[(ulong)obj & 7];
    }
    local_50 = local_10->instance_size;
    if (local_50 == 0) {
      BVar1 = isSmallObject(obj);
      if (BVar1 == '\0') {
        local_28 = obj->isa;
      }
      else {
        local_28 = SmallObjectClasses[(ulong)obj & 7];
      }
      BVar1 = class_isMetaClass(local_28);
      if (BVar1 != '\0') {
        local_50 = 0x88;
      }
    }
    obj_local = (id)((long)&obj->isa + local_50);
  }
  return obj_local;
}

Assistant:

void *object_getIndexedIvars(id obj)
{
	CHECK_ARG(obj);
	size_t size = classForObject(obj)->instance_size;
	if ((0 == size) && class_isMetaClass(classForObject(obj)))
	{
		size = sizeof(struct objc_class);
	}
	return ((char*)obj) + size;
}